

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

string * __thiscall CSubNet::ToString_abi_cxx11_(string *__return_storage_ptr__,CSubNet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uint uVar3;
  pointer pcVar4;
  undefined8 uVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  char cVar10;
  long in_FS_OFFSET;
  string suffix;
  uchar local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if ((this->network).m_net - NET_IPV4 < 2) {
    uVar3 = (this->network).m_addr._size;
    uVar6 = uVar3 - 0x11;
    if (uVar3 < 0x11) {
      uVar6 = uVar3;
    }
    if (0x10 < uVar6) {
      __assert_fail("network.m_addr.size() <= sizeof(netmask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                    ,0x420,"std::string CSubNet::ToString() const");
    }
    if (uVar6 == 0) {
      local_69 = '\0';
    }
    else {
      uVar9 = 0;
      local_69 = '\0';
      do {
        bVar2 = this->netmask[uVar9];
        if (bVar2 < 0xe0) {
          if (bVar2 == 0x80) {
            cVar10 = '\x01';
          }
          else {
            if (bVar2 != 0xc0) {
              if (bVar2 != 0) goto switchD_00d511e8_caseD_f9;
              break;
            }
            cVar10 = '\x02';
          }
        }
        else {
          switch(bVar2) {
          case 0xf8:
            cVar10 = '\x05';
            break;
          case 0xf9:
          case 0xfa:
          case 0xfb:
          case 0xfd:
switchD_00d511e8_caseD_f9:
            cVar10 = -1;
            break;
          case 0xfc:
            cVar10 = '\x06';
            break;
          case 0xfe:
            cVar10 = '\a';
            break;
          case 0xff:
            cVar10 = '\b';
            break;
          default:
            if (bVar2 == 0xe0) {
              cVar10 = '\x03';
            }
            else {
              if (bVar2 != 0xf0) goto switchD_00d511e8_caseD_f9;
              cVar10 = '\x04';
            }
          }
        }
        local_69 = local_69 + cVar10;
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
    tinyformat::format<unsigned_char>(&local_68,"/%u",&local_69);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_48,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  CNetAddr::ToStringAddr_abi_cxx11_(&local_68,&this->network);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_68,local_48._M_dataplus._M_p,local_48._M_string_length);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar8) {
    uVar5 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CSubNet::ToString() const
{
    std::string suffix;

    switch (network.m_net) {
    case NET_IPV4:
    case NET_IPV6: {
        assert(network.m_addr.size() <= sizeof(netmask));

        uint8_t cidr = 0;

        for (size_t i = 0; i < network.m_addr.size(); ++i) {
            if (netmask[i] == 0x00) {
                break;
            }
            cidr += NetmaskBits(netmask[i]);
        }

        suffix = strprintf("/%u", cidr);
        break;
    }
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
    case NET_INTERNAL:
    case NET_UNROUTABLE:
    case NET_MAX:
        break;
    }

    return network.ToStringAddr() + suffix;
}